

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O2

Var Js::JavascriptFunction::NewInstanceHelper
              (ScriptContext *scriptContext,RecyclableObject *function,CallInfo callInfo,
              ArgumentReader *args,FunctionKind functionKind)

{
  JavascriptLibrary *pJVar1;
  Type TVar2;
  FunctionProxy *proxy;
  code *pcVar3;
  StringCache *this;
  bool bVar4;
  int iVar5;
  charcount_t cVar6;
  uint32 uVar7;
  undefined4 *puVar8;
  JavascriptString *pJVar9;
  JavascriptString *pJVar10;
  FunctionInfo *pFVar11;
  undefined4 extraout_var;
  GeneratorVirtualScriptFunction *scriptFunction;
  undefined4 extraout_var_00;
  ScriptContext *scriptContext_00;
  ParseableFunctionInfo *pPVar12;
  FunctionBody *body;
  TopLevelNewFunctionBodyResolveInfo *pTVar13;
  GeneratorVirtualScriptFunction *ptr;
  RecyclableObject *constructor;
  uint uVar14;
  undefined4 in_register_00000084;
  undefined1 isAsync;
  uint i;
  Type *this_00;
  ulong uVar15;
  char cVar16;
  uint uVar17;
  undefined1 local_b8 [8];
  EvalMapString key;
  FunctionInfo *local_80;
  FunctionInfo *pfuncInfoCache;
  JavascriptString *local_70;
  Var local_68;
  code *local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  JavascriptString *local_48;
  StringCache *local_40;
  uint local_38;
  byte local_32;
  char local_31;
  
  local_50 = CONCAT44(in_register_00000084,functionKind);
  pJVar1 = (((function->type).ptr)->javascriptLibrary).ptr;
  if (((ulong)(args->super_Arguments).Info & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                ,0x85,"(args.Info.Count > 0)","Should always have implicit \'this\'"
                               );
    if (!bVar4) goto LAB_00a879ae;
    *puVar8 = 0;
  }
  local_38 = (uint)local_50 & 0xfffffffe;
  local_68 = Arguments::GetNewTarget(&args->super_Arguments);
  key._32_8_ = (args->super_Arguments).Info;
  local_31 = JavascriptOperators::GetAndAssertIsConstructorSuperCall((Arguments *)&key.strict);
  this_00 = &pJVar1->stringCache;
  local_48 = StringCache::GetCommaDisplay(this_00);
  local_40 = this_00;
  pJVar9 = StringCache::GetOpenRBracket(this_00);
  for (uVar15 = 1; this = local_40, uVar15 < (*(uint *)&(args->super_Arguments).Info & 0xffffff) - 1
      ; uVar15 = uVar15 + 1) {
    if (uVar15 != 1) {
      pJVar9 = JavascriptString::Concat(pJVar9,local_48);
    }
    pJVar10 = JavascriptConversion::ToString((args->super_Arguments).Values[uVar15],scriptContext);
    pJVar9 = JavascriptString::Concat(pJVar9,pJVar10);
  }
  iVar5 = (int)local_50;
  local_32 = (iVar5 - 1U & 0xfffffffd) == 0;
  pJVar10 = StringCache::GetNewLineCloseRBracket(local_40);
  pJVar9 = JavascriptString::Concat(pJVar9,pJVar10);
  TVar2 = (args->super_Arguments).Info;
  if (((ulong)TVar2 & 0xfffffe) == 0) {
    pFVar11 = (FunctionInfo *)0x0;
  }
  else {
    pFVar11 = (FunctionInfo *)
              JavascriptConversion::ToString
                        ((args->super_Arguments).Values[(ulong)(TVar2._0_4_ & 0xffffff) - 1],
                         scriptContext);
  }
  if (iVar5 == 2) {
    pJVar10 = StringCache::GetAsyncFunctionAnonymous(this);
  }
  else if (iVar5 == 1) {
    pJVar10 = StringCache::GetFunctionPTRAnonymous(this);
  }
  else if (iVar5 == 3) {
    pJVar10 = StringCache::GetAsyncGeneratorAnonymous(this);
  }
  else {
    pJVar10 = StringCache::GetFunctionAnonymous(this);
  }
  local_70 = pJVar9;
  pJVar9 = JavascriptString::Concat(pJVar10,pJVar9);
  pJVar10 = StringCache::GetSpaceOpenBracket(this);
  pJVar9 = JavascriptString::Concat(pJVar9,pJVar10);
  pfuncInfoCache = pFVar11;
  if (pFVar11 != (FunctionInfo *)0x0) {
    pJVar9 = JavascriptString::Concat(pJVar9,(JavascriptString *)pFVar11);
  }
  pJVar10 = StringCache::GetNewLineCloseBracket(this);
  pJVar9 = JavascriptString::Concat(pJVar9,pJVar10);
  local_80 = (FunctionInfo *)0x0;
  iVar5 = (*(pJVar9->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])(pJVar9);
  cVar6 = JavascriptString::GetLength(pJVar9);
  local_40 = (StringCache *)CONCAT44(local_40._4_4_,cVar6);
  isAsync = 0;
  local_48 = (JavascriptString *)CONCAT44(extraout_var,iVar5);
  EvalMapStringInternal<false>::EvalMapStringInternal
            ((EvalMapStringInternal<false> *)local_b8,(FinalizableObject *)pJVar9,
             (char16 *)CONCAT44(extraout_var,iVar5),cVar6,0,0,0);
  bVar4 = ScriptContext::IsInNewFunctionMap
                    (scriptContext,(EvalMapStringInternal<false> *)local_b8,&local_80);
  uVar14 = local_38;
  pJVar9 = local_70;
  if (bVar4) {
    pJVar1 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
    proxy = (local_80->functionBodyImpl).ptr;
    if ((local_80->attributes & (Async|Generator)) == None) {
      scriptFunction =
           (GeneratorVirtualScriptFunction *)JavascriptLibrary::CreateScriptFunction(pJVar1,proxy);
    }
    else {
      scriptFunction = JavascriptLibrary::CreateGeneratorVirtualScriptFunction(pJVar1,proxy);
    }
  }
  else {
    bVar4 = local_38 == 2;
    iVar5 = (*(local_70->super_RecyclableObject).super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(local_70);
    cVar6 = JavascriptString::GetLength(pJVar9);
    local_60 = Parser::ValidateFormals;
    uStack_58 = 0;
    uVar14 = (uint)local_32;
    GlobalObject::ValidateSyntax
              ((GlobalObject *)scriptContext,(ScriptContext *)CONCAT44(extraout_var_00,iVar5),
               (char16 *)(ulong)cVar6,uVar14,bVar4,(bool)isAsync,0xce922a);
    pFVar11 = pfuncInfoCache;
    if (pfuncInfoCache != (FunctionInfo *)0x0) {
      bVar4 = local_38 == 2;
      scriptContext_00 =
           (ScriptContext *)
           (**(code **)(pfuncInfoCache->originalEntryPoint + 0x328))(pfuncInfoCache);
      cVar6 = JavascriptString::GetLength((JavascriptString *)pFVar11);
      local_60 = Parser::ValidateSourceElementList;
      uStack_58 = 0;
      GlobalObject::ValidateSyntax
                ((GlobalObject *)scriptContext,scriptContext_00,(char16 *)(ulong)cVar6,uVar14,bVar4,
                 (bool)isAsync,0xce9260);
    }
    scriptFunction =
         (GeneratorVirtualScriptFunction *)
         (*((scriptContext->super_ScriptContextBase).globalObject)->EvalHelper)
                   (scriptContext,(char16_t *)local_48,(uint32)local_40,0,0x10,L"Function code",1,1,
                    0);
    pPVar12 = GetParseableFunctionInfo((JavascriptFunction *)scriptFunction);
    uVar14 = local_38;
    if (pPVar12 == (ParseableFunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                  ,0xdc,"(functionInfo)","functionInfo");
      if (!bVar4) goto LAB_00a879ae;
      *puVar8 = 0;
    }
    uVar7 = ParseableFunctionInfo::GetGrfscr(pPVar12);
    ParseableFunctionInfo::SetGrfscr(pPVar12,uVar7 | 0x1000);
    if (scriptContext->TTDRecordOrReplayModeEnabled == false) {
      ScriptContext::AddToNewFunctionMap
                (scriptContext,(EvalMapString *)local_b8,
                 (pPVar12->super_FunctionProxy).functionInfo.ptr);
    }
  }
  if ((scriptFunction != (GeneratorVirtualScriptFunction *)0x0) &&
     ((scriptContext->TTDRecordModeEnabled != false ||
      (scriptContext->TTDShouldPerformReplayAction == true)))) {
    pPVar12 = GetParseableFunctionInfo((JavascriptFunction *)scriptFunction);
    body = TTD::JsSupport::ForceAndGetFunctionBody(pPVar12);
    bVar4 = TTD::ScriptContextTTD::IsBodyAlreadyLoadedAtTopLevel(scriptContext->TTDContextInfo,body)
    ;
    if (!bVar4) {
      uVar7 = 0;
      if (scriptContext->TTDRecordModeEnabled == true) {
        pTVar13 = TTD::EventLog::AddNewFunction
                            (scriptContext->threadContext->TTDLog,body,0,(char16 *)local_48,
                             (uint32)local_40);
        if (scriptContext->TTDShouldPerformRecordAction == true) {
          TTD::EventLog::RecordTopLevelCodeAction
                    (scriptContext->threadContext->TTDLog,(pTVar13->TopLevelBase).TopLevelBodyCtr);
        }
        uVar7 = (pTVar13->TopLevelBase).TopLevelBodyCtr;
        uVar14 = local_38;
      }
      if (scriptContext->TTDShouldPerformReplayAction == true) {
        uVar7 = TTD::EventLog::ReplayTopLevelCodeAction(scriptContext->threadContext->TTDLog);
      }
      TTD::ScriptContextTTD::ProcessFunctionBodyOnLoad
                (scriptContext->TTDContextInfo,body,(FunctionBody *)0x0);
      TTD::ScriptContextTTD::RegisterNewScript(scriptContext->TTDContextInfo,body,uVar7);
      if (scriptContext->TTDShouldPerformRecordOrReplayAction == true) {
        ((body->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
        m_sourceInfoId = uVar7;
      }
      if (scriptContext->TTDShouldPerformReplayDebuggerAction == true) {
        TTD::ExecutionInfoManager::ProcessScriptLoad
                  (scriptContext->threadContext->TTDExecutionInfo,scriptContext,uVar7,body,
                   (body->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr,
                   (CompileScriptException *)0x0);
      }
    }
  }
  uVar17 = (uint)local_50;
  if (((uVar17 | 2) == 3) || (cVar16 = local_31, uVar14 == 2)) {
    if ((((scriptFunction->super_ScriptFunction).super_ScriptFunctionBase.super_JavascriptFunction.
          functionInfo.ptr)->attributes & (Async|Generator)) == None) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                  ,0x124,"(pfuncScript->GetFunctionInfo()->IsCoroutine())",
                                  "pfuncScript->GetFunctionInfo()->IsCoroutine()");
      if (!bVar4) {
LAB_00a879ae:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar8 = 0;
    }
    pJVar1 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
    if (uVar17 == 2) {
      ptr = (GeneratorVirtualScriptFunction *)
            JavascriptLibrary::CreateAsyncFunction
                      (pJVar1,JavascriptAsyncFunction::EntryAsyncFunctionImplementation,
                       scriptFunction);
    }
    else if (uVar17 == 3) {
      ptr = (GeneratorVirtualScriptFunction *)
            JavascriptLibrary::CreateAsyncGeneratorFunction
                      (pJVar1,JavascriptAsyncGeneratorFunction::
                              EntryAsyncGeneratorFunctionImplementation,scriptFunction);
    }
    else {
      ptr = (GeneratorVirtualScriptFunction *)
            JavascriptLibrary::CreateGeneratorFunction
                      (pJVar1,JavascriptGeneratorFunction::EntryGeneratorFunctionImplementation,
                       scriptFunction);
    }
    cVar16 = local_31;
    Memory::WriteBarrierPtr<Js::JavascriptGeneratorFunction>::WriteBarrierSet
              (&scriptFunction->realFunction,(JavascriptGeneratorFunction *)ptr);
    scriptFunction = ptr;
  }
  if (cVar16 != '\0') {
    constructor = VarTo<Js::RecyclableObject>(local_68);
    scriptFunction =
         (GeneratorVirtualScriptFunction *)
         JavascriptOperators::OrdinaryCreateFromConstructor
                   (constructor,(RecyclableObject *)scriptFunction,(DynamicObject *)0x0,
                    scriptContext);
  }
  return scriptFunction;
}

Assistant:

Var JavascriptFunction::NewInstanceHelper(ScriptContext *scriptContext, RecyclableObject* function, CallInfo callInfo, Js::ArgumentReader& args, FunctionKind functionKind /* = FunctionKind::Normal */)
    {
        JavascriptLibrary* library = function->GetLibrary();

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");

        bool isAsync = functionKind == FunctionKind::Async || functionKind == FunctionKind::AsyncGenerator;
        bool isGenerator = functionKind == FunctionKind::Generator || functionKind == FunctionKind::AsyncGenerator;

        // SkipDefaultNewObject function flag should have prevented the default object from
        // being created, except when call true a host dispatch.
        Var newTarget = args.GetNewTarget();
        bool isCtorSuperCall = JavascriptOperators::GetAndAssertIsConstructorSuperCall(args);

        JavascriptString* separator = library->GetCommaDisplayString();

        // Gather all the formals into a string like (fml1, fml2, fml3)
        JavascriptString *formals = library->GetOpenRBracketString();

        for (uint i = 1; i < args.Info.Count - 1; ++i)
        {
            if (i != 1)
            {
                formals = JavascriptString::Concat(formals, separator);
            }
            formals = JavascriptString::Concat(formals, JavascriptConversion::ToString(args.Values[i], scriptContext));
        }
        formals = JavascriptString::Concat(formals, library->GetNewLineCloseRBracketString());
        // Function body, last argument to Function(...)
        JavascriptString *fnBody = NULL;
        if (args.Info.Count > 1)
        {
            fnBody = JavascriptConversion::ToString(args.Values[args.Info.Count - 1], scriptContext);
        }

        // Create a string representing the anonymous function
        Assert(
            0 + // "function anonymous" GetFunctionAnonymousString
            0 + // "("   GetOpenRBracketString
            1 + // "\n)" GetNewLineCloseRBracketString
            0 // " {"  GetSpaceOpenBracketString
            == numberLinesPrependedToAnonymousFunction); // Be sure to add exactly one line to anonymous function

        JavascriptString *bs = functionKind == FunctionKind::Async ?
            library->GetAsyncFunctionAnonymousString() :
            functionKind == FunctionKind::Generator ?
            library->GetFunctionPTRAnonymousString() :
            functionKind == FunctionKind::AsyncGenerator ?
            library->GetAsyncGeneratorAnonymousString() :
            library->GetFunctionAnonymousString();

        bs = JavascriptString::Concat(bs, formals);
        bs = JavascriptString::Concat(bs, library->GetSpaceOpenBracketString());
        if (fnBody != NULL)
        {
            bs = JavascriptString::Concat(bs, fnBody);
        }

        bs = JavascriptString::Concat(bs, library->GetNewLineCloseBracketString());
        // Bug 1105479. Get the module id from the caller
        ModuleID moduleID = kmodGlobal;

        BOOL strictMode = FALSE;

        JavascriptFunction* pfuncScript;
        FunctionInfo *pfuncInfoCache = NULL;
        char16 const * sourceString = bs->GetSz();
        charcount_t sourceLen = bs->GetLength();
        EvalMapString key(bs, sourceString, sourceLen, moduleID, strictMode, /* isLibraryCode = */ false);
        if (!scriptContext->IsInNewFunctionMap(key, &pfuncInfoCache))
        {
            // Validate formals here
            scriptContext->GetGlobalObject()->ValidateSyntax(
                scriptContext, formals->GetSz(), formals->GetLength(),
                isGenerator, isAsync,
                &Parser::ValidateFormals);
            if (fnBody != NULL)
            {
                // Validate function body
                scriptContext->GetGlobalObject()->ValidateSyntax(
                    scriptContext, fnBody->GetSz(), fnBody->GetLength(),
                    isGenerator, isAsync,
                    &Parser::ValidateSourceElementList);
            }

            pfuncScript = scriptContext->GetGlobalObject()->EvalHelper(scriptContext, sourceString, sourceLen, moduleID, fscrCanDeferFncParse, Constants::FunctionCode, TRUE, TRUE, strictMode);

            // Indicate that this is a top-level function. We don't pass the fscrGlobalCode flag to the eval helper,
            // or it will return the global function that wraps the declared function body, as though it were an eval.
            // But we want, for instance, to be able to verify that we did the right amount of deferred parsing.
            ParseableFunctionInfo *functionInfo = pfuncScript->GetParseableFunctionInfo();
            Assert(functionInfo);
            functionInfo->SetGrfscr(functionInfo->GetGrfscr() | fscrGlobalCode);

#if ENABLE_TTD
            if(!scriptContext->IsTTDRecordOrReplayModeEnabled())
            {
                scriptContext->AddToNewFunctionMap(key, functionInfo->GetFunctionInfo());
            }
#else
            scriptContext->AddToNewFunctionMap(key, functionInfo->GetFunctionInfo());
#endif
        }
        else if (pfuncInfoCache->IsCoroutine())
        {
            pfuncScript = scriptContext->GetLibrary()->CreateGeneratorVirtualScriptFunction(pfuncInfoCache->GetFunctionProxy());
        }
        else
        {
            pfuncScript = scriptContext->GetLibrary()->CreateScriptFunction(pfuncInfoCache->GetFunctionProxy());
        }

#if ENABLE_TTD
        //
        //TODO: We may (probably?) want to use the debugger source rundown functionality here instead
        //
        if(pfuncScript != nullptr && (scriptContext->IsTTDRecordModeEnabled() || scriptContext->ShouldPerformReplayAction()))
        {
            //Make sure we have the body and text information available
            FunctionBody* globalBody = TTD::JsSupport::ForceAndGetFunctionBody(pfuncScript->GetParseableFunctionInfo());
            if(!scriptContext->TTDContextInfo->IsBodyAlreadyLoadedAtTopLevel(globalBody))
            {
                uint32 bodyIdCtr = 0;

                if(scriptContext->IsTTDRecordModeEnabled())
                {
                    const TTD::NSSnapValues::TopLevelNewFunctionBodyResolveInfo* tbfi = scriptContext->GetThreadContext()->TTDLog->AddNewFunction(globalBody, moduleID, sourceString, sourceLen);

                    //We always want to register the top-level load but we don't always need to log the event
                    if(scriptContext->ShouldPerformRecordAction())
                    {
                        scriptContext->GetThreadContext()->TTDLog->RecordTopLevelCodeAction(tbfi->TopLevelBase.TopLevelBodyCtr);
                    }

                    bodyIdCtr = tbfi->TopLevelBase.TopLevelBodyCtr;
                }

                if(scriptContext->ShouldPerformReplayAction())
                {
                    bodyIdCtr = scriptContext->GetThreadContext()->TTDLog->ReplayTopLevelCodeAction();
                }

                //walk global body to (1) add functions to pin set (2) build parent map
                scriptContext->TTDContextInfo->ProcessFunctionBodyOnLoad(globalBody, nullptr);
                scriptContext->TTDContextInfo->RegisterNewScript(globalBody, bodyIdCtr);

                if(scriptContext->ShouldPerformRecordOrReplayAction())
                {
                    globalBody->GetUtf8SourceInfo()->SetSourceInfoForDebugReplay_TTD(bodyIdCtr);
                }

                if(scriptContext->ShouldPerformReplayDebuggerAction())
                {
                    scriptContext->GetThreadContext()->TTDExecutionInfo->ProcessScriptLoad(scriptContext, bodyIdCtr, globalBody, globalBody->GetUtf8SourceInfo(), nullptr);
                }
            }
        }
#endif

        JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_FUNCTION(pfuncScript, EtwTrace::GetFunctionId(pfuncScript->GetFunctionProxy())));

        if (isGenerator || isAsync)
        {
            Assert(pfuncScript->GetFunctionInfo()->IsCoroutine());
            auto pfuncVirt = static_cast<GeneratorVirtualScriptFunction*>(pfuncScript);
            auto pfuncGen = functionKind == FunctionKind::Async ?
                scriptContext->GetLibrary()->CreateAsyncFunction(JavascriptAsyncFunction::EntryAsyncFunctionImplementation, pfuncVirt) :
                functionKind == FunctionKind::AsyncGenerator ?
                scriptContext->GetLibrary()->CreateAsyncGeneratorFunction(JavascriptAsyncGeneratorFunction::EntryAsyncGeneratorFunctionImplementation, pfuncVirt) :
                scriptContext->GetLibrary()->CreateGeneratorFunction(JavascriptGeneratorFunction::EntryGeneratorFunctionImplementation, pfuncVirt);
            pfuncVirt->SetRealGeneratorFunction(pfuncGen);
            pfuncScript = pfuncGen;
        }

        return isCtorSuperCall ?
            JavascriptOperators::OrdinaryCreateFromConstructor(VarTo<RecyclableObject>(newTarget), pfuncScript, nullptr, scriptContext) :
            pfuncScript;
    }